

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

uint __thiscall
llvm::detail::IEEEFloat::convertToHexString
          (IEEEFloat *this,char *dst,uint hexDigits,bool upperCase,roundingMode rounding_mode)

{
  char *pcVar1;
  char local_63;
  char local_61;
  undefined2 *local_60;
  char *local_50;
  char *p;
  roundingMode rounding_mode_local;
  bool upperCase_local;
  char *pcStack_18;
  uint hexDigits_local;
  char *dst_local;
  IEEEFloat *this_local;
  
  pcStack_18 = dst;
  if (((byte)this->field_0x12 >> 3 & 1) != 0) {
    pcStack_18 = dst + 1;
    *dst = '-';
  }
  switch(this->field_0x12 & 7) {
  case 0:
    if (upperCase) {
      local_50 = "INFINITY";
    }
    else {
      local_50 = "infinity";
    }
    *(undefined8 *)pcStack_18 = *(undefined8 *)local_50;
    pcStack_18 = pcStack_18 + 8;
    break;
  case 1:
    if (upperCase) {
      local_60 = &NaNU;
    }
    else {
      local_60 = &NaNL;
    }
    *(undefined2 *)pcStack_18 = *local_60;
    pcStack_18[2] = *(char *)(local_60 + 1);
    pcStack_18 = pcStack_18 + 3;
    break;
  case 2:
    pcStack_18 = convertNormalToHexString(this,pcStack_18,hexDigits,upperCase,rounding_mode);
    break;
  case 3:
    *pcStack_18 = '0';
    local_61 = 'X';
    if (!upperCase) {
      local_61 = 'x';
    }
    pcStack_18[1] = local_61;
    pcStack_18[2] = '0';
    pcVar1 = pcStack_18 + 3;
    if (1 < hexDigits) {
      pcStack_18[3] = '.';
      memset(pcStack_18 + 4,0x30,(ulong)(hexDigits - 1));
      pcVar1 = pcStack_18 + 4 + (hexDigits - 1);
    }
    pcStack_18 = pcVar1;
    local_63 = 'P';
    if (!upperCase) {
      local_63 = 'p';
    }
    pcVar1 = pcStack_18 + 1;
    *pcStack_18 = local_63;
    pcStack_18 = pcStack_18 + 2;
    *pcVar1 = '0';
  }
  *pcStack_18 = '\0';
  return (int)pcStack_18 - (int)dst;
}

Assistant:

unsigned int IEEEFloat::convertToHexString(char *dst, unsigned int hexDigits,
                                           bool upperCase,
                                           roundingMode rounding_mode) const {
  char *p;

  p = dst;
  if (sign)
    *dst++ = '-';

  switch (category) {
  case fcInfinity:
    memcpy (dst, upperCase ? infinityU: infinityL, sizeof infinityU - 1);
    dst += sizeof infinityL - 1;
    break;

  case fcNaN:
    memcpy (dst, upperCase ? NaNU: NaNL, sizeof NaNU - 1);
    dst += sizeof NaNU - 1;
    break;

  case fcZero:
    *dst++ = '0';
    *dst++ = upperCase ? 'X': 'x';
    *dst++ = '0';
    if (hexDigits > 1) {
      *dst++ = '.';
      memset (dst, '0', hexDigits - 1);
      dst += hexDigits - 1;
    }
    *dst++ = upperCase ? 'P': 'p';
    *dst++ = '0';
    break;

  case fcNormal:
    dst = convertNormalToHexString (dst, hexDigits, upperCase, rounding_mode);
    break;
  }

  *dst = 0;

  return static_cast<unsigned int>(dst - p);
}